

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int fwdata_device_version(char *device_path)

{
  FILE *__stream;
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  long in_FS_OFFSET;
  igsc_device_handle handle;
  igsc_fwdata_version2 fwdata_version;
  undefined8 local_60;
  igsc_fwdata_version2 local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = 0;
  iVar1 = igsc_device_init_by_device(&local_60,device_path);
  if (iVar1 == 0) {
    local_58.flags = 0;
    local_58.data_arb_svn = 0;
    local_58.data_arb_svn_fitb = 0;
    local_58.format_version = 0;
    local_58.oem_manuf_data_version = 0;
    local_58.oem_manuf_data_version_fitb = 0;
    local_58.major_version = 0;
    local_58.major_vcn = 0;
    iVar5 = 3;
    do {
      iVar1 = igsc_device_fwdata_version2(&local_60,&local_58);
      if (iVar1 != 0xd) break;
      usleep(2000000);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if (iVar1 == 0) {
      print_fwdata_version("Device: ",&local_58);
    }
    else if (iVar1 == 0xc) {
      if (quiet == '\0') {
        fprintf(_stderr,
                "Error: Permission denied: missing required credentials to access the device %s\n",
                device_path);
      }
    }
    else {
      if (quiet == '\0') {
        fprintf(_stderr,"Error: Failed to get fwdata version from device: %s\n",device_path);
      }
      __stream = _stdout;
      if (quiet == '\0') {
        uVar2 = igsc_get_last_firmware_status(&local_60);
        uVar4 = igsc_translate_firmware_status(uVar2);
        uVar3 = igsc_get_last_firmware_status(&local_60);
        fprintf(__stream,"Firmware status: %s (0x%x)\n",uVar4,(ulong)uVar3);
      }
    }
    igsc_device_close(&local_60);
  }
  else if (quiet == '\0') {
    fprintf(_stderr,"Error: Failed to initialize device: %s\n",device_path);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

mockable_static
int fwdata_device_version(const char *device_path)
{
    struct igsc_fwdata_version2 fwdata_version;
    struct igsc_device_handle handle;
    int ret;
    unsigned int retries = 0;

    memset(&handle, 0, sizeof(handle));
    ret = igsc_device_init_by_device(&handle, device_path);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to initialize device: %s\n", device_path);
        return ret;
    }

    memset(&fwdata_version, 0, sizeof(fwdata_version));
    while ((ret = igsc_device_fwdata_version2(&handle, &fwdata_version)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret != IGSC_SUCCESS)
    {
        if (ret == IGSC_ERROR_PERMISSION_DENIED)
        {
            fwupd_error("Permission denied: missing required credentials to access the device %s\n", device_path);
        }
        else
        {
            fwupd_error("Failed to get fwdata version from device: %s\n", device_path);
            print_device_fw_status(&handle);
        }
        goto exit;
    }

    print_dev_fwdata_version(&fwdata_version);

exit:
    (void)igsc_device_close(&handle);
    return ret;
}